

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_30::NetworkAddressImpl::clone
          (NetworkAddressImpl *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *__src;
  _func_int **capacity;
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **__dest;
  LowLevelAsyncIoProvider *pLVar3;
  Array<kj::(anonymous_namespace)::SocketAddress> result;
  
  pp_Var1 = *(_func_int ***)(__fn + 8);
  pp_Var2 = *(_func_int ***)(__fn + 0x10);
  __src = *(void **)(__fn + 0x18);
  capacity = *(_func_int ***)(__fn + 0x20);
  __dest = (_func_int **)
           _::HeapArrayDisposer::allocateImpl
                     (0x88,0,(size_t)capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
  ;
  if (capacity != (_func_int **)0x0) {
    memcpy(__dest,__src,(long)capacity * 0x88);
  }
  pLVar3 = (LowLevelAsyncIoProvider *)operator_new(0x38);
  pLVar3->_vptr_LowLevelAsyncIoProvider = (_func_int **)&PTR_connect_0044cbb8;
  pLVar3[1]._vptr_LowLevelAsyncIoProvider = pp_Var1;
  pLVar3[2]._vptr_LowLevelAsyncIoProvider = pp_Var2;
  pLVar3[3]._vptr_LowLevelAsyncIoProvider = __dest;
  pLVar3[4]._vptr_LowLevelAsyncIoProvider = capacity;
  pLVar3[5]._vptr_LowLevelAsyncIoProvider = (_func_int **)&_::HeapArrayDisposer::instance;
  *(undefined4 *)&pLVar3[6]._vptr_LowLevelAsyncIoProvider = 0;
  (this->super_NetworkAddress)._vptr_NetworkAddress =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressImpl>::instance;
  this->lowLevel = pLVar3;
  return (int)this;
}

Assistant:

Own<NetworkAddress> clone() override {
    return kj::heap<NetworkAddressImpl>(lowLevel, filter, kj::heapArray(addrs.asPtr()));
  }